

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

void capnp::_::anon_unknown_133::dynamicCheckTestMessage<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  double dVar1;
  SegmentReader *pSVar2;
  bool result;
  ReaderFor<bool> RVar3;
  int8_t iVar4;
  uint8_t uVar5;
  bool bVar6;
  int16_t iVar7;
  uint16_t uVar8;
  int32_t iVar9;
  uint32_t uVar10;
  uchar *puVar11;
  size_type sVar12;
  float fVar13;
  ReaderFor<DynamicEnum> RVar14;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  StringPtr name_64;
  StringPtr name_65;
  initializer_list<capnp::Void> expected;
  StringPtr name_66;
  initializer_list<bool> expected_00;
  StringPtr name_67;
  initializer_list<signed_char> expected_01;
  StringPtr name_68;
  initializer_list<short> expected_02;
  StringPtr name_69;
  initializer_list<int> expected_03;
  StringPtr name_70;
  initializer_list<long> expected_04;
  StringPtr name_71;
  initializer_list<unsigned_char> expected_05;
  StringPtr name_72;
  initializer_list<unsigned_short> expected_06;
  StringPtr name_73;
  initializer_list<unsigned_int> expected_07;
  StringPtr name_74;
  initializer_list<unsigned_long> expected_08;
  StringPtr name_75;
  initializer_list<float> expected_09;
  StringPtr name_76;
  initializer_list<double> expected_10;
  StringPtr name_77;
  initializer_list<capnp::Text::Reader> expected_11;
  StringPtr name_78;
  initializer_list<capnp::Data::Reader> expected_12;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  StringPtr name_85;
  StringPtr name_86;
  initializer_list<const_char_*> expected_13;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  StringPtr name_90;
  StringPtr name_91;
  initializer_list<bool> expected_14;
  StringPtr name_92;
  initializer_list<signed_char> expected_15;
  StringPtr name_93;
  initializer_list<short> expected_16;
  StringPtr name_94;
  initializer_list<int> expected_17;
  StringPtr name_95;
  initializer_list<long> expected_18;
  StringPtr name_96;
  initializer_list<unsigned_char> expected_19;
  StringPtr name_97;
  initializer_list<unsigned_short> expected_20;
  StringPtr name_98;
  initializer_list<unsigned_int> expected_21;
  StringPtr name_99;
  initializer_list<unsigned_long> expected_22;
  StringPtr name_x00100;
  StringPtr name_x00101;
  StringPtr name_x00102;
  initializer_list<capnp::Text::Reader> expected_23;
  StringPtr name_x00103;
  initializer_list<capnp::Data::Reader> expected_24;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  StringPtr name_x00110;
  StringPtr name_x00111;
  initializer_list<const_char_*> expected_25;
  DynamicEnum e;
  DynamicEnum e_00;
  DynamicEnum e_01;
  DynamicEnum e_02;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_31;
  DebugComparison<const_capnp::Void_&,_capnp::Void> _kjCondition;
  undefined1 local_8e0;
  undefined1 local_8d8;
  ReaderFor<capnp::DynamicStruct> subSubReader;
  DebugExpression<bool> _kjCondition_10;
  undefined1 auStack_87f [15];
  ArrayPtr<const_char> local_848;
  DebugExpression<bool> _kjCondition_24;
  undefined1 auStack_837 [15];
  bool local_810;
  char *local_800;
  DebugComparison<const_char_(&)[14],_capnp::Text::Reader> _kjCondition_29;
  Reader local_7c8;
  Reader local_780;
  Reader local_738;
  Reader local_6f0;
  Reader local_6a8;
  Reader local_660;
  Reader local_618;
  Reader local_5d0;
  Reader local_588;
  Reader local_540;
  Reader local_4f8;
  Reader local_4b0;
  Reader local_468;
  Reader local_420;
  Reader local_3d8;
  Reader local_390;
  Reader local_348;
  Reader local_300;
  Reader local_2b8;
  Reader local_270;
  Reader local_228;
  Reader local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  _kjCondition_29.right.super_StringPtr.content.ptr = *_kjCondition_29.left;
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left = (Void *)&VOID;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = true;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_00.content.size_ = 10;
    name_00.content.ptr = "voidField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_00);
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x158,ERROR,
               "\"failed: expected \" \"(VOID) == (reader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, reader.get(\"voidField\").template as<Void>()"
               ,(char (*) [73])
                "failed: expected (VOID) == (reader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_01.content.size_ = 10;
  name_01.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_01);
  RVar3 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left._0_2_ = CONCAT11(RVar3,1);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,RVar3);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_1_ = 1;
    name_02.content.size_ = 10;
    name_02.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_02);
    _kjCondition_10.value =
         DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    kj::_::Debug::log<char_const(&)[73],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [73])
                "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&subSubReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_03.content.size_ = 10;
  name_03.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_03);
  iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(iVar4,0xffffff85);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar4 == -0x7b);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xffffff85;
    name_04.content.size_ = 10;
    name_04.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_04);
    iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_31);
    _kjCondition_10.value = (bool)iVar4;
    kj::_::Debug::log<char_const(&)[75],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -123, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subSubReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_05.content.size_ = 0xb;
  name_05.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_05);
  iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(iVar7,0xffffcfc7);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == -0x3039);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xffffcfc7;
    name_06.content.size_ = 0xb;
    name_06.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_06);
    iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    __kjCondition_10 = iVar7;
    kj::_::Debug::log<char_const(&)[79],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15b,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, -12345, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [79])
                "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subSubReader,
               (short *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_07.content.size_ = 0xb;
  name_07.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_07);
  iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(iVar9,0xff439eb2);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar9 == -0xbc614e);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xff439eb2;
    name_08.content.size_ = 0xb;
    name_08.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_08);
    iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    __kjCondition_10 = iVar9;
    kj::_::Debug::log<char_const(&)[82],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15c,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -12345678, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [82])
                "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
               ,(DebugComparison<int,_int> *)&_kjCondition,(int *)&subSubReader,
               (int *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_09.content.size_ = 0xb;
  name_09.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_09);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == -0x7048860ddf79;
  _kjCondition.left = (Void *)0xffff8fb779f22087;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0xffff8fb779f22087;
    name_10.content.size_ = 0xb;
    name_10.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_10);
    puVar11 = (uchar *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Reader *)&_kjCondition_31);
    __kjCondition_10 = puVar11;
    kj::_::Debug::log<char_const(&)[91],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15d,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [91])
                "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
               ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&subSubReader,
               (long *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_11.content.size_ = 0xb;
  name_11.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_11);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(uVar5,0xea);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar5 == 0xea);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xea;
    name_12.content.size_ = 0xb;
    name_12.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_12);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_31);
    _kjCondition_10.value = (bool)uVar5;
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15e,ERROR,
               "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [77])
                "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subSubReader,
               &_kjCondition_10.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_13.content.size_ = 0xc;
  name_13.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_13);
  uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(uVar8,0xb26e);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 0xb26e);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xb26e;
    name_14.content.size_ = 0xc;
    name_14.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_14);
    uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_31);
    __kjCondition_10 = uVar8;
    kj::_::Debug::
    log<char_const(&)[81],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15f,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [81])
                "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subSubReader
               ,(unsigned_short *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_15.content.size_ = 0xc;
  name_15.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_15);
  uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                     ((Reader *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(uVar10,0xce0a6a14);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 0xce0a6a14)
  ;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xce0a6a14;
    name_16.content.size_ = 0xc;
    name_16.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_16);
    uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                       ((Reader *)&_kjCondition_31);
    __kjCondition_10 = uVar10;
    kj::_::Debug::
    log<char_const(&)[86],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x160,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [86])
                "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subSubReader,
               (uint *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_17.content.size_ = 0xc;
  name_17.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_17);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Reader *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == 0xab54a98ceb1f0ad2;
  _kjCondition.left = (Void *)0xab54a98ceb1f0ad2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0xab54a98ceb1f0ad2;
    name_18.content.size_ = 0xc;
    name_18.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_18);
    puVar11 = (uchar *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Reader *)&_kjCondition_31);
    __kjCondition_10 = puVar11;
    kj::_::Debug::
    log<char_const(&)[98],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x161,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [98])
                "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long_long *)&subSubReader,(unsigned_long *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_19.content.size_ = 0xd;
  name_19.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_19);
  fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  bVar6 = kj::_::floatAlmostEqual(fVar13,1234.5);
  _kjCondition_10.value = bVar6;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_20.content.size_ = 0xd;
    name_20.content.ptr = "float32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_20);
    fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    _kjCondition.left = (Void *)CONCAT44(_kjCondition.left._4_4_,fVar13);
    subSubReader.schema.super_Schema.raw._0_4_ = 0x449a5000;
    kj::_::Debug::log<char_const(&)[101],kj::_::DebugExpression<bool>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x162,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", _kjCondition, reader.get(\"float32Field\").template as<float>(), 1234.5f"
               ,(char (*) [101])
                "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
               ,&_kjCondition_10,(float *)&_kjCondition,(float *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_21.content.size_ = 0xd;
  name_21.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_21);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  bVar6 = kj::_::doubleAlmostEqual(dVar1,-1.23e+47);
  _kjCondition_10.value = bVar6;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition_10.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_22.content.size_ = 0xd;
    name_22.content.ptr = "float64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_22);
    _kjCondition.left =
         (Void *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                           ((Reader *)&_kjCondition_31);
    subSubReader.schema.super_Schema.raw = (Schema)0xc9b58b82c0e0bb00;
    kj::_::Debug::log<char_const(&)[103],kj::_::DebugExpression<bool>&,double,double>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", _kjCondition, reader.get(\"float64Field\").template as<double>(), -123e45"
               ,(char (*) [103])
                "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
               ,&_kjCondition_10,(double *)&_kjCondition,(double *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  __kjCondition_10 = (uchar *)"foo";
  name_23.content.size_ = 10;
  name_23.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_23);
  subSubReader._0_16_ =
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_10,(Reader *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((bool)local_8e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_24.content.size_ = 10;
    name_24.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_24);
    subSubReader._0_16_ =
         DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[74],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"foo\", reader.get(\"textField\").template as<Text>()"
               ,(char (*) [74])
                "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])"foo",(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  subSubReader._0_16_ = _::data("bar");
  name_25.content.size_ = 10;
  name_25.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_25);
  __kjCondition_10 =
       (ArrayPtr<const_unsigned_char>)
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_31);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
             (DebugExpression<capnp::Data::Reader> *)&subSubReader,(Reader *)&_kjCondition_10);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((bool)local_8d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader._0_16_ = _::data("bar");
    name_26.content.size_ = 10;
    name_26.content.ptr = "dataField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_26);
    __kjCondition_10 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
               ,(char (*) [80])
                "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&subSubReader,(Reader *)&_kjCondition_10);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_27.content.size_ = 0xc;
  name_27.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_27);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition_31);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  name_28.content.size_ = 10;
  name_28.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_28);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left = (Void *)&VOID;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = true;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_29.content.size_ = 10;
    name_29.content.ptr = "voidField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_29);
    DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[76],kj::_::DebugComparison<capnp::Void_const&,capnp::Void>&,capnp::Void_const&,capnp::Void>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(VOID) == (subReader.get(\\\"voidField\\\").template as<Void>())\", _kjCondition, VOID, subReader.get(\"voidField\").template as<Void>()"
               ,(char (*) [76])
                "failed: expected (VOID) == (subReader.get(\"voidField\").template as<Void>())",
               &_kjCondition,(Void *)&VOID,(Void *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_30);
  RVar3 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left._0_2_ = CONCAT11(RVar3,1);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,RVar3);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_1_ = 1;
    name_31.content.size_ = 10;
    name_31.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_31);
    _kjCondition_24.value =
         DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    kj::_::Debug::log<char_const(&)[76],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x169,ERROR,
               "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", _kjCondition, true, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [76])
                "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
               (DebugComparison<bool,_bool> *)&_kjCondition,(bool *)&subSubReader,
               &_kjCondition_24.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_32.content.size_ = 10;
  name_32.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_32);
  iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(iVar4,0xfffffff4);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar4 == -0xc);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xfffffff4;
    name_33.content.size_ = 10;
    name_33.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_33);
    iVar4 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_31);
    _kjCondition_24.value = (bool)iVar4;
    kj::_::Debug::log<char_const(&)[77],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", _kjCondition, -12, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [77])
                "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subSubReader,
               &_kjCondition_24.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_34);
  iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(iVar7,0xd80);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar7 == 0xd80);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xd80;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_35);
    iVar7 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    __kjCondition_24 = iVar7;
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", _kjCondition, 3456, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [80])
                "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subSubReader,
               (short *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_36);
  iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(iVar9,0xfb4c100e);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,iVar9 == -0x4b3eff2);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0xfb4c100e;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_37);
    iVar9 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    __kjCondition_24 = iVar9;
    kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16c,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", _kjCondition, -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [85])
                "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
               ,(DebugComparison<int,_int> *)&_kjCondition,(int *)&subSubReader,
               (int *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_38);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == 0x33a638e8734e;
  _kjCondition.left = (Void *)0x33a638e8734e;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0x33a638e8734e;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_39);
    puVar11 = (uchar *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Reader *)&_kjCondition_31);
    __kjCondition_24 = puVar11;
    kj::_::Debug::log<char_const(&)[92],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16d,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", _kjCondition, 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [92])
                "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
               ,(DebugComparison<long_long,_long> *)&_kjCondition,(longlong *)&subSubReader,
               (long *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_40.content.size_ = 0xb;
  name_40.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_40);
  uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_31);
  _kjCondition.left._0_5_ = CONCAT14(uVar5,0x5a);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar5 == 'Z');
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0x5a;
    name_41.content.size_ = 0xb;
    name_41.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_41);
    uVar5 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_31);
    _kjCondition_24.value = (bool)uVar5;
    kj::_::Debug::
    log<char_const(&)[79],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", _kjCondition, 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [79])
                "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subSubReader,
               &_kjCondition_24.value);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_42);
  uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                    ((Reader *)&_kjCondition_31);
  _kjCondition.left._0_6_ = CONCAT24(uVar8,0x4d2);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar8 == 0x4d2);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0x4d2;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_43);
    uVar8 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Reader *)&_kjCondition_31);
    __kjCondition_24 = uVar8;
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", _kjCondition, 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [83])
                "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subSubReader
               ,(unsigned_short *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_44);
  uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                     ((Reader *)&_kjCondition_31);
  _kjCondition.left = (Void *)CONCAT44(uVar10,0x3628814);
  _kjCondition._8_8_ = anon_var_dwarf_3d166;
  _kjCondition.op.content.ptr = &DAT_00000005;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,uVar10 == 0x3628814);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((char)_kjCondition.op.content.size_ == '\0') && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw._0_4_ = 0x3628814;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_45);
    uVar10 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                       ((Reader *)&_kjCondition_31);
    __kjCondition_24 = uVar10;
    kj::_::Debug::
    log<char_const(&)[87],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", _kjCondition, 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [87])
                "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subSubReader,
               (uint *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_46.content.size_ = 0xc;
  name_46.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_46);
  _kjCondition._8_8_ =
       DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                 ((Reader *)&_kjCondition_31);
  _kjCondition.result = _kjCondition._8_8_ == 0x4cc1921126f0ad2;
  _kjCondition.left = (Void *)0x4cc1921126f0ad2;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader.schema.super_Schema.raw = (Schema)0x4cc1921126f0ad2;
    name_47.content.size_ = 0xc;
    name_47.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_47);
    puVar11 = (uchar *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Reader *)&_kjCondition_31);
    __kjCondition_24 = puVar11;
    kj::_::Debug::
    log<char_const(&)[99],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x171,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", _kjCondition, 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [99])
                "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(DebugComparison<unsigned_long_long,_unsigned_long> *)&_kjCondition,
               (unsigned_long_long *)&subSubReader,(unsigned_long *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_48);
  fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  bVar6 = kj::_::floatAlmostEqual(fVar13,-1.25e-10);
  _kjCondition_24.value = bVar6;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition_24.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_49.content.size_ = 0xd;
    name_49.content.ptr = "float32Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_49);
    fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
    _kjCondition.left = (Void *)CONCAT44(_kjCondition.left._4_4_,fVar13);
    subSubReader.schema.super_Schema.raw._0_4_ = 0xaf09705f;
    kj::_::Debug::log<char_const(&)[107],kj::_::DebugExpression<bool>&,float,float>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", _kjCondition, subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
               ,(char (*) [107])
                "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
               ,&_kjCondition_24,(float *)&_kjCondition,(float *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_50.content.size_ = 0xd;
  name_50.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_50);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
  bVar6 = kj::_::doubleAlmostEqual(dVar1,345.0);
  _kjCondition_24.value = bVar6;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if ((_kjCondition_24.value == false) && (kj::_::Debug::minSeverity < 3)) {
    name_51.content.size_ = 0xd;
    name_51.content.ptr = "float64Field";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_51);
    _kjCondition.left =
         (Void *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                           ((Reader *)&_kjCondition_31);
    subSubReader.schema.super_Schema.raw._0_4_ = 0x159;
    kj::_::Debug::log<char_const(&)[102],kj::_::DebugExpression<bool>&,double,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x173,ERROR,
               "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", _kjCondition, subReader.get(\"float64Field\").template as<double>(), 345"
               ,(char (*) [102])
                "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
               ,&_kjCondition_24,(double *)&_kjCondition,(int *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  __kjCondition_24 = "baz";
  name_52.content.size_ = 10;
  name_52.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_52);
  subSubReader._0_16_ =
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_24,(Reader *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((bool)local_8e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_53.content.size_ = 10;
    name_53.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_53);
    subSubReader._0_16_ =
         DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[77],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"baz\", subReader.get(\"textField\").template as<Text>()"
               ,(char (*) [77])
                "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])0x4758b0,(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  subSubReader._0_16_ = _::data("qux");
  name_54.content.size_ = 10;
  name_54.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_54);
  __kjCondition_24 =
       (ArrayPtr<const_unsigned_char>)
       DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_31);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
             (DebugExpression<capnp::Data::Reader> *)&subSubReader,(Reader *)&_kjCondition_24);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((bool)local_8d8 == false) && (kj::_::Debug::minSeverity < 3)) {
    subSubReader._0_16_ = _::data("qux");
    name_55.content.size_ = 10;
    name_55.content.ptr = "dataField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_55);
    __kjCondition_24 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Reader>&,capnp::Data::Reader,capnp::Data::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x175,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", _kjCondition, data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
               ,(char (*) [83])
                "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
               ,(DebugComparison<capnp::Data::Reader,_capnp::Data::Reader> *)&_kjCondition,
               (Reader *)&subSubReader,(Reader *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  name_56.content.size_ = 0xc;
  name_56.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_56);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&subSubReader,(Reader *)&_kjCondition_31);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  _kjCondition_29.left = (char (*) [14])0x461dbd;
  name_57.content.size_ = 10;
  name_57.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&subSubReader,name_57);
  __kjCondition_24 =
       (ArrayPtr<const_unsigned_char>)
       DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[7]> *)&_kjCondition_29,(Reader *)&_kjCondition_24);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((bool)local_8e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_58.content.size_ = 10;
    name_58.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&subSubReader,name_58);
    __kjCondition_24 =
         (ArrayPtr<const_unsigned_char>)
         DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                   ((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[83],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Reader>&,char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x178,ERROR,
               "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"nested\", subSubReader.get(\"textField\").template as<Text>()"
               ,(char (*) [83])
                "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
               ,(DebugComparison<const_char_(&)[7],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [7])0x461dbd,(Reader *)&_kjCondition_24);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  local_800 = "really nested";
  name_59.content.size_ = 0xc;
  name_59.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition,&subSubReader,name_59);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
  name_60.content.size_ = 10;
  name_60.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_60);
  local_848 = (ArrayPtr<const_char>)
              DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                        ((Reader *)&_kjCondition_31);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            (&_kjCondition_29,(DebugExpression<char_const(&)[14]> *)&local_800,(Reader *)&local_848)
  ;
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  if ((_kjCondition_29.result == false) && (kj::_::Debug::minSeverity < 3)) {
    name_61.content.size_ = 0xc;
    name_61.content.ptr = "structField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition,&subSubReader,name_61);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
    name_62.content.size_ = 10;
    name_62.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_62);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_31);
    kj::_::Debug::
    log<char_const(&)[139],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Reader>&,char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x17a,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [139])
                "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,&_kjCondition_29,(char (*) [14])"really nested",(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
  }
  __kjCondition_24 = "baz";
  name_63.content.size_ = 10;
  name_63.content.ptr = "enumField";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_63);
  RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                     ((Reader *)&_kjCondition_31);
  e._8_8_ = RVar14._8_8_;
  e.schema.super_Schema.raw._4_4_ = 0;
  e.schema.super_Schema.raw._0_4_ = RVar14._8_4_;
  subSubReader._0_16_ =
       anon_unknown_133::name((anon_unknown_133 *)RVar14.schema.super_Schema.raw.super_Schema,e);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
             (DebugExpression<char_const(&)[4]> *)&_kjCondition_24,(Reader *)&subSubReader);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  if (((bool)local_8e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    name_64.content.size_ = 10;
    name_64.content.ptr = "enumField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_64);
    RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                       ((Reader *)&_kjCondition_31);
    e_00._8_8_ = RVar14._8_8_;
    e_00.schema.super_Schema.raw._4_4_ = 0;
    e_00.schema.super_Schema.raw._0_4_ = RVar14._8_4_;
    subSubReader._0_16_ =
         anon_unknown_133::name
                   ((anon_unknown_133 *)RVar14.schema.super_Schema.raw.super_Schema,e_00);
    kj::_::Debug::
    log<char_const(&)[90],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", _kjCondition, \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
               ,(char (*) [90])
                "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
               ,(DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)&_kjCondition,
               (char (*) [4])0x4758b0,(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  }
  sVar12 = 9;
  name_65.content.size_ = 9;
  name_65.content.ptr = "voidList";
  DynamicStruct::Reader::get(&local_78,(Reader *)&_kjCondition_10,name_65);
  expected._M_len = sVar12;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Reader>
            ((_ *)&local_78,(Reader *)&_kjCondition_31,expected);
  DynamicValue::Reader::~Reader(&local_78);
  sVar12 = 9;
  name_66.content.size_ = 9;
  name_66.content.ptr = "boolList";
  DynamicStruct::Reader::get(&local_c0,(Reader *)&_kjCondition_10,name_66);
  _kjCondition_31._0_5_ = 0x101000100;
  expected_00._M_len = sVar12;
  expected_00._M_array = (iterator)&DAT_00000005;
  checkList<bool,capnp::DynamicValue::Reader>((_ *)&local_c0,(Reader *)&_kjCondition_31,expected_00)
  ;
  DynamicValue::Reader::~Reader(&local_c0);
  sVar12 = 9;
  name_67.content.size_ = 9;
  name_67.content.ptr = "int8List";
  DynamicStruct::Reader::get(&local_108,(Reader *)&_kjCondition_10,name_67);
  _kjCondition_31.left = 0x7f80de0c;
  expected_01._M_len = sVar12;
  expected_01._M_array = &DAT_00000004;
  checkList<signed_char,capnp::DynamicValue::Reader>
            ((_ *)&local_108,(Reader *)&_kjCondition_31,expected_01);
  DynamicValue::Reader::~Reader(&local_108);
  sVar12 = 10;
  name_68.content.size_ = 10;
  name_68.content.ptr = "int16List";
  DynamicStruct::Reader::get(&local_150,(Reader *)&_kjCondition_10,name_68);
  _kjCondition_31.left = 0xe9d204d2;
  _kjCondition_31.right = 0x7fff8000;
  expected_02._M_len = sVar12;
  expected_02._M_array = (iterator)&DAT_00000004;
  checkList<short,capnp::DynamicValue::Reader>
            ((_ *)&local_150,(Reader *)&_kjCondition_31,expected_02);
  DynamicValue::Reader::~Reader(&local_150);
  sVar12 = 10;
  name_69.content.size_ = 10;
  name_69.content.ptr = "int32List";
  DynamicStruct::Reader::get(&local_198,(Reader *)&_kjCondition_10,name_69);
  _kjCondition_31.left = 0xbc614e;
  _kjCondition_31.right = 0xfaa0d340;
  _kjCondition_31.op.content.ptr = (char *)0x7fffffff80000000;
  expected_03._M_len = sVar12;
  expected_03._M_array = (iterator)&DAT_00000004;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_198,(Reader *)&_kjCondition_31,expected_03)
  ;
  DynamicValue::Reader::~Reader(&local_198);
  sVar12 = 10;
  name_70.content.size_ = 10;
  name_70.content.ptr = "int64List";
  DynamicStruct::Reader::get(&local_1e0,(Reader *)&_kjCondition_10,name_70);
  _kjCondition_31.op.content.size_ = 0x8000000000000000;
  _kjCondition_31.result = true;
  _kjCondition_31._25_7_ = 0x7fffffffffffff;
  _kjCondition_31.op.content.ptr = (char *)0xfffd968afd13752e;
  _kjCondition_31.left = 0x860ddf79;
  _kjCondition_31.right = 0x7048;
  expected_04._M_len = sVar12;
  expected_04._M_array = (iterator)&DAT_00000004;
  checkList<long,capnp::DynamicValue::Reader>
            ((_ *)&local_1e0,(Reader *)&_kjCondition_31,expected_04);
  DynamicValue::Reader::~Reader(&local_1e0);
  sVar12 = 10;
  name_71.content.size_ = 10;
  name_71.content.ptr = "uInt8List";
  DynamicStruct::Reader::get(&local_228,(Reader *)&_kjCondition_10,name_71);
  _kjCondition_31.left = 0xff00220c;
  expected_05._M_len = sVar12;
  expected_05._M_array = &DAT_00000004;
  checkList<unsigned_char,capnp::DynamicValue::Reader>
            ((_ *)&local_228,(Reader *)&_kjCondition_31,expected_05);
  DynamicValue::Reader::~Reader(&local_228);
  sVar12 = 0xb;
  name_72.content.size_ = 0xb;
  name_72.content.ptr = "uInt16List";
  DynamicStruct::Reader::get(&local_270,(Reader *)&_kjCondition_10,name_72);
  _kjCondition_31.left = 0x162e04d2;
  _kjCondition_31.right = 0xffff0000;
  expected_06._M_len = sVar12;
  expected_06._M_array = (iterator)&DAT_00000004;
  checkList<unsigned_short,capnp::DynamicValue::Reader>
            ((_ *)&local_270,(Reader *)&_kjCondition_31,expected_06);
  DynamicValue::Reader::~Reader(&local_270);
  sVar12 = 0xb;
  name_73.content.size_ = 0xb;
  name_73.content.ptr = "uInt32List";
  DynamicStruct::Reader::get(&local_2b8,(Reader *)&_kjCondition_10,name_73);
  _kjCondition_31.left = 0xbc614e;
  _kjCondition_31.right = 0x55f2cc0;
  _kjCondition_31.op.content.ptr = (char *)0xffffffff00000000;
  expected_07._M_len = sVar12;
  expected_07._M_array = (iterator)&DAT_00000004;
  checkList<unsigned_int,capnp::DynamicValue::Reader>
            ((_ *)&local_2b8,(Reader *)&_kjCondition_31,expected_07);
  DynamicValue::Reader::~Reader(&local_2b8);
  sVar12 = 0xb;
  name_74.content.size_ = 0xb;
  name_74.content.ptr = "uInt64List";
  DynamicStruct::Reader::get(&local_300,(Reader *)&_kjCondition_10,name_74);
  _kjCondition_31.op.content.size_ = 0;
  _kjCondition_31.result = true;
  _kjCondition_31._25_7_ = 0xffffffffffffff;
  _kjCondition_31.left = 0x860ddf79;
  _kjCondition_31.right = 0x7048;
  _kjCondition_31.op.content.ptr = (char *)0x2697502ec8ad2;
  expected_08._M_len = sVar12;
  expected_08._M_array = (iterator)&DAT_00000004;
  checkList<unsigned_long,capnp::DynamicValue::Reader>
            ((_ *)&local_300,(Reader *)&_kjCondition_31,expected_08);
  DynamicValue::Reader::~Reader(&local_300);
  sVar12 = 0xc;
  name_75.content.size_ = 0xc;
  name_75.content.ptr = "float32List";
  DynamicStruct::Reader::get(&local_348,(Reader *)&_kjCondition_10,name_75);
  _kjCondition_31.left = 0;
  _kjCondition_31.right = 0x4996b438;
  _kjCondition_31.op.content.ptr = (char *)0xfcf0bdc27cf0bdc2;
  _kjCondition_31.op.content.size_ = 0x82081cea02081cea;
  expected_09._M_len = sVar12;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Reader>
            ((_ *)&local_348,(Reader *)&_kjCondition_31,expected_09);
  DynamicValue::Reader::~Reader(&local_348);
  sVar12 = 0xc;
  name_76.content.size_ = 0xc;
  name_76.content.ptr = "float64List";
  DynamicStruct::Reader::get(&local_390,(Reader *)&_kjCondition_10,name_76);
  _kjCondition_31.op.content.size_ = 0x7f76c8e5ca239029;
  _kjCondition_31.result = true;
  _kjCondition_31._25_7_ = 0xff76c8e5ca2390;
  _kjCondition_31.left = 0;
  _kjCondition_31.right = 0;
  _kjCondition_31.op.content.ptr = (char *)0x42dc12218377de40;
  expected_10._M_len = sVar12;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Reader>
            ((_ *)&local_390,(Reader *)&_kjCondition_31,expected_10);
  DynamicValue::Reader::~Reader(&local_390);
  sVar12 = 9;
  name_77.content.size_ = 9;
  name_77.content.ptr = "textList";
  DynamicStruct::Reader::get(&local_3d8,(Reader *)&_kjCondition_10,name_77);
  _kjCondition_31.op.content.ptr = &DAT_00000005;
  _kjCondition_31._0_8_ = "quux";
  _kjCondition_31._24_8_ = 6;
  _kjCondition_31.op.content.size_ = (size_t)"corge";
  expected_11._M_len = sVar12;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_3d8,(Reader *)&_kjCondition_31,expected_11);
  DynamicValue::Reader::~Reader(&local_3d8);
  sVar12 = 9;
  name_78.content.size_ = 9;
  name_78.content.ptr = "dataList";
  DynamicStruct::Reader::get(&local_780,(Reader *)&_kjCondition_10,name_78);
  _kjCondition_31._0_16_ = _::data("garply");
  _kjCondition_31._16_16_ = _::data("waldo");
  _::data("fred");
  expected_12._M_len = sVar12;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>
            ((_ *)&local_780,(Reader *)&_kjCondition_31,expected_12);
  DynamicValue::Reader::~Reader(&local_780);
  name_79.content.size_ = 0xb;
  name_79.content.ptr = "structList";
  DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_79);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&subSubReader,(Reader *)&_kjCondition_31);
  DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
  _kjCondition_31.right = subSubReader.reader.dataSize;
  _kjCondition_31.left = 3;
  _kjCondition_31.op.content.ptr = " == ";
  _kjCondition_31.result = subSubReader.reader.dataSize == 3;
  _kjCondition_31.op.content.size_ = 5;
  if (subSubReader.reader.dataSize == 3) {
    local_800 = "x structlist 1";
    DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
    name_80.content.size_ = 10;
    name_80.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_80);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_31);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_29,
               (DebugExpression<char_const(&)[15]> *)&local_800,(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    if ((_kjCondition_29.result == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,0);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
      name_81.content.size_ = 10;
      name_81.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_81);
      local_848 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&_kjCondition_31);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_29,
                 (char (*) [15])"x structlist 1",(Reader *)&local_848);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    }
    local_800 = "x structlist 2";
    DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
    name_82.content.size_ = 10;
    name_82.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_82);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_31);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_29,
               (DebugExpression<char_const(&)[15]> *)&local_800,(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    if ((_kjCondition_29.result == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,1);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
      name_83.content.size_ = 10;
      name_83.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_83);
      local_848 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&_kjCondition_31);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x191,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_29,
                 (char (*) [15])"x structlist 2",(Reader *)&local_848);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    }
    local_800 = "x structlist 3";
    DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,2);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
    name_84.content.size_ = 10;
    name_84.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_84);
    local_848 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&_kjCondition_31);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_29,
               (DebugExpression<char_const(&)[15]> *)&local_800,(Reader *)&local_848);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    if ((_kjCondition_29.result == false) && (kj::_::Debug::minSeverity < 3)) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,2);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_24,(Reader *)&_kjCondition);
      name_85.content.size_ = 10;
      name_85.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_24,name_85);
      local_848 = (ArrayPtr<const_char>)
                  DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                            ((Reader *)&_kjCondition_31);
      kj::_::Debug::
      log<char_const(&)[121],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Reader>&,char_const(&)[15],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x192,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                 ,(char (*) [121])
                  "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                 ,(DebugComparison<const_char_(&)[15],_capnp::Text::Reader> *)&_kjCondition_29,
                 (char (*) [15])"x structlist 3",(Reader *)&local_848);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
    }
    sVar12 = 9;
    name_86.content.size_ = 9;
    name_86.content.ptr = "enumList";
    DynamicStruct::Reader::get(&local_420,(Reader *)&_kjCondition_10,name_86);
    _kjCondition_31.op.content.size_ = (size_t)"grault";
    _kjCondition_31.op.content.ptr = "bar";
    _kjCondition_31._0_8_ = "qux";
    expected_13._M_len = sVar12;
    expected_13._M_array = (iterator)0x3;
    checkEnumList<capnp::DynamicValue::Reader>
              ((anon_unknown_133 *)&local_420,(Reader *)&_kjCondition_31,expected_13);
    DynamicValue::Reader::~Reader(&local_420);
    __kjCondition_10 = (uchar *)"corge";
    name_87.content.size_ = 10;
    name_87.content.ptr = "enumField";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_87);
    RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                       ((Reader *)&_kjCondition_31);
    e_01._8_8_ = RVar14._8_8_;
    e_01.schema.super_Schema.raw._4_4_ = 0;
    e_01.schema.super_Schema.raw._0_4_ = RVar14._8_4_;
    subSubReader._0_16_ =
         anon_unknown_133::name
                   ((anon_unknown_133 *)RVar14.schema.super_Schema.raw.super_Schema,e_01);
    kj::_::DebugExpression<char_const(&)[6]>::operator==
              ((DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
               (DebugExpression<char_const(&)[6]> *)&_kjCondition_10,(Reader *)&subSubReader);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    if (((bool)local_8e0 == false) && (kj::_::Debug::minSeverity < 3)) {
      name_88.content.size_ = 10;
      name_88.content.ptr = "enumField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_88);
      RVar14 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply
                         ((Reader *)&_kjCondition_31);
      e_02._8_8_ = RVar14._8_8_;
      e_02.schema.super_Schema.raw._4_4_ = 0;
      e_02.schema.super_Schema.raw._0_4_ = RVar14._8_4_;
      subSubReader._0_16_ =
           anon_unknown_133::name
                     ((anon_unknown_133 *)RVar14.schema.super_Schema.raw.super_Schema,e_02);
      kj::_::Debug::
      log<char_const(&)[89],kj::_::DebugComparison<char_const(&)[6],capnp::Text::Reader>&,char_const(&)[6],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x196,ERROR,
                 "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", _kjCondition, \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [89])
                  "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(DebugComparison<const_char_(&)[6],_capnp::Text::Reader> *)&_kjCondition,
                 (char (*) [6])"corge",(Reader *)&subSubReader);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    }
    name_89.content.size_ = 9;
    name_89.content.ptr = "voidList";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_89);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_31);
    subSubReader.schema.super_Schema.raw._4_4_ = _local_8e0;
    subSubReader.schema.super_Schema.raw._0_4_ = 6;
    subSubReader.reader.segment = (SegmentReader *)" == ";
    subSubReader.reader.capTable = (CapTableReader *)&DAT_00000005;
    subSubReader.reader.data = (void *)CONCAT71(subSubReader.reader.data._1_7_,_local_8e0 == 6);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    if (((char)subSubReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
      __kjCondition_10 = 6;
      name_90.content.size_ = 9;
      name_90.content.ptr = "voidList";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_90);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_31);
      __kjCondition_24 = _local_8e0;
      kj::_::Debug::
      log<char_const(&)[84],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", _kjCondition, 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
                 ,(char (*) [84])
                  "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
                 ,(DebugComparison<unsigned_int,_unsigned_int> *)&subSubReader,
                 (uint *)&_kjCondition_10,(uint *)&_kjCondition_24);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    }
    sVar12 = 9;
    name_91.content.size_ = 9;
    name_91.content.ptr = "boolList";
    DynamicStruct::Reader::get(&local_468,&reader,name_91);
    _kjCondition_31.left = 0x1000001;
    expected_14._M_len = sVar12;
    expected_14._M_array = (iterator)&DAT_00000004;
    checkList<bool,capnp::DynamicValue::Reader>
              ((_ *)&local_468,(Reader *)&_kjCondition_31,expected_14);
    DynamicValue::Reader::~Reader(&local_468);
    sVar12 = 9;
    name_92.content.size_ = 9;
    name_92.content.ptr = "int8List";
    DynamicStruct::Reader::get(&local_4b0,&reader,name_92);
    _kjCondition_31.left._0_2_ = 0x916f;
    expected_15._M_len = sVar12;
    expected_15._M_array = (iterator)0x2;
    checkList<signed_char,capnp::DynamicValue::Reader>
              ((_ *)&local_4b0,(Reader *)&_kjCondition_31,expected_15);
    DynamicValue::Reader::~Reader(&local_4b0);
    sVar12 = 10;
    name_93.content.size_ = 10;
    name_93.content.ptr = "int16List";
    DynamicStruct::Reader::get(&local_4f8,&reader,name_93);
    _kjCondition_31.left = 0xd4992b67;
    expected_16._M_len = sVar12;
    expected_16._M_array = (iterator)0x2;
    checkList<short,capnp::DynamicValue::Reader>
              ((_ *)&local_4f8,(Reader *)&_kjCondition_31,expected_16);
    DynamicValue::Reader::~Reader(&local_4f8);
    sVar12 = 10;
    name_94.content.size_ = 10;
    name_94.content.ptr = "int32List";
    DynamicStruct::Reader::get(&local_540,&reader,name_94);
    _kjCondition_31.left = 0x69f6bc7;
    _kjCondition_31.right = 0xf9609439;
    expected_17._M_len = sVar12;
    expected_17._M_array = (iterator)0x2;
    checkList<int,capnp::DynamicValue::Reader>
              ((_ *)&local_540,(Reader *)&_kjCondition_31,expected_17);
    DynamicValue::Reader::~Reader(&local_540);
    sVar12 = 10;
    name_95.content.size_ = 10;
    name_95.content.ptr = "int64List";
    DynamicStruct::Reader::get(&local_588,&reader,name_95);
    _kjCondition_31.op.content.ptr = (char *)0xf0948a54d43b8e39;
    _kjCondition_31.left = 0x2bc471c7;
    _kjCondition_31.right = 0xf6b75ab;
    expected_18._M_len = sVar12;
    expected_18._M_array = (iterator)0x2;
    checkList<long,capnp::DynamicValue::Reader>
              ((_ *)&local_588,(Reader *)&_kjCondition_31,expected_18);
    DynamicValue::Reader::~Reader(&local_588);
    sVar12 = 10;
    name_96.content.size_ = 10;
    name_96.content.ptr = "uInt8List";
    DynamicStruct::Reader::get(&local_5d0,&reader,name_96);
    _kjCondition_31.left._0_2_ = 0xde6f;
    expected_19._M_len = sVar12;
    expected_19._M_array = (iterator)0x2;
    checkList<unsigned_char,capnp::DynamicValue::Reader>
              ((_ *)&local_5d0,(Reader *)&_kjCondition_31,expected_19);
    DynamicValue::Reader::~Reader(&local_5d0);
    sVar12 = 0xb;
    name_97.content.size_ = 0xb;
    name_97.content.ptr = "uInt16List";
    DynamicStruct::Reader::get(&local_618,&reader,name_97);
    _kjCondition_31.left = 0xad9c8235;
    expected_20._M_len = sVar12;
    expected_20._M_array = (iterator)0x2;
    checkList<unsigned_short,capnp::DynamicValue::Reader>
              ((_ *)&local_618,(Reader *)&_kjCondition_31,expected_20);
    DynamicValue::Reader::~Reader(&local_618);
    sVar12 = 0xb;
    name_98.content.size_ = 0xb;
    name_98.content.ptr = "uInt32List";
    DynamicStruct::Reader::get(&local_660,&reader,name_98);
    _kjCondition_31.left = 0xc6aea155;
    expected_21._M_len = sVar12;
    expected_21._M_array = (iterator)0x1;
    checkList<unsigned_int,capnp::DynamicValue::Reader>
              ((_ *)&local_660,(Reader *)&_kjCondition_31,expected_21);
    DynamicValue::Reader::~Reader(&local_660);
    sVar12 = 0xb;
    name_99.content.size_ = 0xb;
    name_99.content.ptr = "uInt64List";
    DynamicStruct::Reader::get(&local_6a8,&reader,name_99);
    _kjCondition_31.left = 0xb5ac71c7;
    _kjCondition_31.right = 0x9a3298af;
    expected_22._M_len = sVar12;
    expected_22._M_array = (iterator)0x1;
    checkList<unsigned_long,capnp::DynamicValue::Reader>
              ((_ *)&local_6a8,(Reader *)&_kjCondition_31,expected_22);
    DynamicValue::Reader::~Reader(&local_6a8);
    name_x00100.content.size_ = 0xc;
    name_x00100.content.ptr = "float32List";
    DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_x00100);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_31);
    DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
    _kjCondition_31.right = _local_8e0;
    _kjCondition_31.left = 4;
    _kjCondition_31.op.content.ptr = " == ";
    _kjCondition_31.result = _local_8e0 == 4;
    _kjCondition_31.op.content.size_ = 5;
    if (_local_8e0 == 4) {
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,0);
      subSubReader.schema.super_Schema.raw._4_4_ =
           DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
      subSubReader.schema.super_Schema.raw._0_4_ = 0x45ad9c00;
      subSubReader.reader.segment = (SegmentReader *)" == ";
      subSubReader.reader.capTable = (CapTableReader *)&DAT_00000005;
      subSubReader.reader.data =
           (void *)CONCAT71(subSubReader.reader.data._1_7_,
                            subSubReader.schema.super_Schema.raw._4_4_ == 5555.5);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = 0x45ad9c00;
        DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,0);
        fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply
                           ((Reader *)&_kjCondition_31);
        __kjCondition_24 = fVar13;
        kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a5,ERROR,
                   "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", _kjCondition, 5555.5f, listReader[0].template as<float>()"
                   ,(char (*) [67])
                    "failed: expected (5555.5f) == (listReader[0].template as<float>())",
                   (DebugComparison<float,_float> *)&subSubReader,(float *)&_kjCondition_10,
                   (float *)&_kjCondition_24);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      }
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,1);
      subSubReader.schema.super_Schema.raw._4_4_ =
           DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
      subSubReader.schema.super_Schema.raw._0_4_ = 0x7f800000;
      subSubReader.reader.segment = (SegmentReader *)" == ";
      subSubReader.reader.capTable = (CapTableReader *)&DAT_00000005;
      subSubReader.reader.data =
           (void *)CONCAT71(subSubReader.reader.data._1_7_,
                            INFINITY <= subSubReader.schema.super_Schema.raw._4_4_);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = 0x7f800000;
        DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,1);
        fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply
                           ((Reader *)&_kjCondition_31);
        __kjCondition_24 = fVar13;
        kj::_::Debug::log<char_const(&)[69],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a6,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", _kjCondition, kj::inf(), listReader[1].template as<float>()"
                   ,(char (*) [69])
                    "failed: expected (kj::inf()) == (listReader[1].template as<float>())",
                   (DebugComparison<float,_float> *)&subSubReader,(float *)&_kjCondition_10,
                   (float *)&_kjCondition_24);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      }
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,2);
      subSubReader.schema.super_Schema.raw._4_4_ =
           DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
      subSubReader.schema.super_Schema.raw._0_4_ = 0xff800000;
      subSubReader.reader.segment = (SegmentReader *)" == ";
      subSubReader.reader.capTable = (CapTableReader *)&DAT_00000005;
      subSubReader.reader.data =
           (void *)CONCAT71(subSubReader.reader.data._1_7_,
                            subSubReader.schema.super_Schema.raw._4_4_ <= -INFINITY);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.reader.data == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = 0xff800000;
        DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,2);
        fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply
                           ((Reader *)&_kjCondition_31);
        __kjCondition_24 = fVar13;
        kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a7,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", _kjCondition, -kj::inf(), listReader[2].template as<float>()"
                   ,(char (*) [70])
                    "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
                   (DebugComparison<float,_float> *)&subSubReader,(float *)&_kjCondition_10,
                   (float *)&_kjCondition_24);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      }
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,3);
      fVar13 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply
                         ((Reader *)&_kjCondition_31);
      subSubReader.schema.super_Schema.raw._0_1_ = NAN(fVar13);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.schema.super_Schema.raw == '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[59],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1a8,ERROR,
                   "\"failed: expected \" \"isNaN(listReader[3].template as<float>())\", _kjCondition"
                   ,(char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())",
                   (DebugExpression<bool> *)&subSubReader);
      }
      name_x00101.content.size_ = 0xc;
      name_x00101.content.ptr = "float64List";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_x00101);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicList> *)&_kjCondition,(Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      _kjCondition_31.op.content.ptr = " == ";
      _kjCondition_31.left = 4;
      _kjCondition_31.right = 4;
      _kjCondition_31.result = true;
      _kjCondition_31.op.content.size_ = 5;
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,0);
      subSubReader.reader.segment =
           (SegmentReader *)
           DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&_kjCondition_31);
      subSubReader.reader.pointers._0_1_ = (double)subSubReader.reader.segment == 7777.75;
      subSubReader.schema.super_Schema.raw = (Schema)0x40be61c000000000;
      subSubReader.reader.capTable = (CapTableReader *)anon_var_dwarf_3d166;
      subSubReader.reader.data = &DAT_00000005;
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.reader.pointers == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_10 = (uchar *)0x40be61c000000000;
        DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,0);
        puVar11 = (uchar *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                     ((Reader *)&_kjCondition_31);
        __kjCondition_24 = puVar11;
        kj::_::Debug::log<char_const(&)[68],kj::_::DebugComparison<double,double>&,double,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1ad,ERROR,
                   "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", _kjCondition, 7777.75, listReader[0].template as<double>()"
                   ,(char (*) [68])
                    "failed: expected (7777.75) == (listReader[0].template as<double>())",
                   (DebugComparison<double,_double> *)&subSubReader,(double *)&_kjCondition_10,
                   (double *)&_kjCondition_24);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      }
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,1);
      pSVar2 = (SegmentReader *)
               DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                         ((Reader *)&_kjCondition_31);
      subSubReader.reader.pointers._0_1_ = INFINITY <= (double)pSVar2;
      subSubReader.schema.super_Schema.raw._0_4_ = 0x7f800000;
      subSubReader.reader.segment = pSVar2;
      subSubReader.reader.capTable = (CapTableReader *)anon_var_dwarf_3d166;
      subSubReader.reader.data = &DAT_00000005;
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.reader.pointers == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_24 = 0x7f800000;
        DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,1);
        puVar11 = (uchar *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                     ((Reader *)&_kjCondition_31);
        __kjCondition_10 = puVar11;
        kj::_::Debug::log<char_const(&)[70],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1ae,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", _kjCondition, kj::inf(), listReader[1].template as<double>()"
                   ,(char (*) [70])
                    "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
                   (DebugComparison<float,_double> *)&subSubReader,(float *)&_kjCondition_24,
                   (double *)&_kjCondition_10);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      }
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,2);
      pSVar2 = (SegmentReader *)
               DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                         ((Reader *)&_kjCondition_31);
      subSubReader.reader.pointers._0_1_ = (double)pSVar2 <= -INFINITY;
      subSubReader.schema.super_Schema.raw._0_4_ = 0xff800000;
      subSubReader.reader.segment = pSVar2;
      subSubReader.reader.capTable = (CapTableReader *)anon_var_dwarf_3d166;
      subSubReader.reader.data = &DAT_00000005;
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.reader.pointers == '\0') && (kj::_::Debug::minSeverity < 3)) {
        __kjCondition_24 = 0xff800000;
        DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,2);
        puVar11 = (uchar *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                     ((Reader *)&_kjCondition_31);
        __kjCondition_10 = puVar11;
        kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1af,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", _kjCondition, -kj::inf(), listReader[2].template as<double>()"
                   ,(char (*) [71])
                    "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
                   (DebugComparison<float,_double> *)&subSubReader,(float *)&_kjCondition_24,
                   (double *)&_kjCondition_10);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      }
      DynamicList::Reader::operator[]((Reader *)&_kjCondition_31,(Reader *)&_kjCondition,3);
      dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                        ((Reader *)&_kjCondition_31);
      subSubReader.schema.super_Schema.raw._0_1_ = NAN(dVar1);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      if (((char)subSubReader.schema.super_Schema.raw == '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[60],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b0,ERROR,
                   "\"failed: expected \" \"isNaN(listReader[3].template as<double>())\", _kjCondition"
                   ,(char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())",
                   (DebugExpression<bool> *)&subSubReader);
      }
      name_x00102.content.size_ = 9;
      name_x00102.content.ptr = "textList";
      DynamicStruct::Reader::get(&local_6f0,&reader,name_x00102);
      _kjCondition_31.op.content.ptr = (char *)0x6;
      _kjCondition_31._0_8_ = "plugh";
      _kjCondition_31._24_8_ = 6;
      _kjCondition_31.op.content.size_ = (size_t)"xyzzy";
      expected_23._M_len = 6;
      expected_23._M_array = (iterator)0x3;
      checkList<capnp::Text,capnp::DynamicValue::Reader>
                ((_ *)&local_6f0,(Reader *)&_kjCondition_31,expected_23);
      DynamicValue::Reader::~Reader(&local_6f0);
      sVar12 = 9;
      name_x00103.content.size_ = 9;
      name_x00103.content.ptr = "dataList";
      DynamicStruct::Reader::get(&local_7c8,&reader,name_x00103);
      _kjCondition_31._0_16_ = _::data("oops");
      _kjCondition_31._16_16_ = _::data("exhausted");
      _::data("rfc3092");
      expected_24._M_len = sVar12;
      expected_24._M_array = (iterator)0x3;
      checkList<capnp::Data,capnp::DynamicValue::Reader>
                ((_ *)&local_7c8,(Reader *)&_kjCondition_31,expected_24);
      DynamicValue::Reader::~Reader(&local_7c8);
      name_x00104.content.size_ = 0xb;
      name_x00104.content.ptr = "structList";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,&reader,name_x00104);
      DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicList> *)&subSubReader,(Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      _kjCondition_31.right = subSubReader.reader.dataSize;
      _kjCondition_31.left = 3;
      _kjCondition_31.op.content.ptr = " == ";
      _kjCondition_31.result = subSubReader.reader.dataSize == 3;
      _kjCondition_31.op.content.size_ = 5;
      if (subSubReader.reader.dataSize != 3) {
        __kjCondition_10 = 3;
        __kjCondition_24 = subSubReader.reader.dataSize;
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b6,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
                   &_kjCondition_31,(uint *)&_kjCondition_10,(uint *)&_kjCondition_24);
        kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
      }
      local_848.ptr = "structlist 1";
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,0);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition);
      name_x00105.content.size_ = 10;
      name_x00105.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_x00105);
      _kjCondition_29._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                     ((Reader *)&_kjCondition_31);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)&_kjCondition_24,
                 (DebugExpression<char_const(&)[13]> *)&local_848,(Reader *)&_kjCondition_29);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      if ((local_810 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,0);
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition);
        name_x00106.content.size_ = 10;
        name_x00106.content.ptr = "textField";
        DynamicStruct::Reader::get
                  ((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_x00106);
        _kjCondition_29._0_16_ =
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                       ((Reader *)&_kjCondition_31);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b7,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)&_kjCondition_24,
                   (char (*) [13])0x461e45,(Reader *)&_kjCondition_29);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      }
      local_848.ptr = "structlist 2";
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,1);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition);
      name_x00107.content.size_ = 10;
      name_x00107.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_x00107);
      _kjCondition_29._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                     ((Reader *)&_kjCondition_31);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)&_kjCondition_24,
                 (DebugExpression<char_const(&)[13]> *)&local_848,(Reader *)&_kjCondition_29);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      if ((local_810 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,1);
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition);
        name_x00108.content.size_ = 10;
        name_x00108.content.ptr = "textField";
        DynamicStruct::Reader::get
                  ((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_x00108);
        _kjCondition_29._0_16_ =
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                       ((Reader *)&_kjCondition_31);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b8,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)&_kjCondition_24,
                   (char (*) [13])0x461e54,(Reader *)&_kjCondition_29);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      }
      local_848.ptr = "structlist 3";
      DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,2);
      DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition);
      name_x00109.content.size_ = 10;
      name_x00109.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_x00109);
      _kjCondition_29._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                     ((Reader *)&_kjCondition_31);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)&_kjCondition_24,
                 (DebugExpression<char_const(&)[13]> *)&local_848,(Reader *)&_kjCondition_29);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
      DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      if ((local_810 == false) && (kj::_::Debug::minSeverity < 3)) {
        DynamicList::Reader::operator[]((Reader *)&_kjCondition,(Reader *)&subSubReader,2);
        DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  ((ReaderFor<DynamicStruct> *)&_kjCondition_10,(Reader *)&_kjCondition);
        name_x00110.content.size_ = 10;
        name_x00110.content.ptr = "textField";
        DynamicStruct::Reader::get
                  ((Reader *)&_kjCondition_31,(Reader *)&_kjCondition_10,name_x00110);
        _kjCondition_29._0_16_ =
             DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                       ((Reader *)&_kjCondition_31);
        kj::_::Debug::
        log<char_const(&)[119],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Reader>&,char_const(&)[13],capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x1b9,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", _kjCondition, \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
                   ,(char (*) [119])
                    "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
                   ,(DebugComparison<const_char_(&)[13],_capnp::Text::Reader> *)&_kjCondition_24,
                   (char (*) [13])0x461e63,(Reader *)&_kjCondition_29);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition_31);
        DynamicValue::Reader::~Reader((Reader *)&_kjCondition);
      }
      sVar12 = 9;
      name_x00111.content.size_ = 9;
      name_x00111.content.ptr = "enumList";
      DynamicStruct::Reader::get(&local_738,&reader,name_x00111);
      _kjCondition_31.op.content.ptr = "garply";
      _kjCondition_31._0_8_ = "foo";
      expected_25._M_len = sVar12;
      expected_25._M_array = (iterator)0x2;
      checkEnumList<capnp::DynamicValue::Reader>
                ((anon_unknown_133 *)&local_738,(Reader *)&_kjCondition_31,expected_25);
      DynamicValue::Reader::~Reader(&local_738);
      return;
    }
    __kjCondition_10 = 4;
    __kjCondition_24 = _local_8e0;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&subSubReader,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a4,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               &_kjCondition_31,(uint *)&_kjCondition_10,(uint *)&_kjCondition_24);
    kj::_::Debug::Fault::fatal((Fault *)&subSubReader);
  }
  __kjCondition_24 = 3;
  _kjCondition_29.left._0_4_ = subSubReader.reader.dataSize;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,399,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             &_kjCondition_31,(uint *)&_kjCondition_24,(uint *)&_kjCondition_29);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}